

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O0

Index __thiscall CPT::Sample(CPT *this,Index y)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  const_reference pdVar4;
  size_type in_RDI;
  Index x;
  double cumprob;
  double randNr;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar5;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  
  iVar1 = rand();
  this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)0x0;
  uVar5 = 0;
  while( true ) {
    uVar2 = (ulong)uVar5;
    sVar3 = nrX((CPT *)0xb02196);
    if (sVar3 <= uVar2) {
      return uVar5;
    }
    pdVar4 = boost::numeric::ublas::
             matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::operator()(this_00,CONCAT44(uVar5,in_stack_ffffffffffffffd8),in_RDI);
    this_00 = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)(*pdVar4 + (double)this_00);
    if ((double)iVar1 / 2147483648.0 <= (double)this_00) break;
    uVar5 = uVar5 + 1;
  }
  return uVar5;
}

Assistant:

Index CPT::Sample(Index y) const
{
    double randNr=rand() / (RAND_MAX + 1.0);
    double cumprob = 0.0;
    Index x;
    for(x=0; x < nrX(); x++)
    {
        cumprob += _m_probTable(x,y);
        if(randNr<=cumprob)
            break;
    }
    return(x);    
}